

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O2

int uts_paramsToStr(char *strBuf,int ind)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  
  pcVar6 = impl_getName();
  iVar3 = sprintf(strBuf + ind,"UTS - Unbalanced Tree Search %s (%s)\n","2.1",pcVar6);
  iVar4 = sprintf(strBuf + (ind + iVar3),"Tree type:  %d (%s)\n",(ulong)type,uts_trees_str[type]);
  iVar4 = ind + iVar3 + iVar4;
  builtin_strncpy(strBuf + iVar4,"Tree shape parameters:\n",0x18);
  iVar3 = sprintf(strBuf + iVar4 + 0x17,"  root branching factor b_0 = %.1f, root seed = %d\n",
                  SUB84(b_0,0),(ulong)(uint)rootId);
  iVar3 = iVar3 + iVar4 + 0x17;
  if (type - GEO < 2) {
    iVar4 = sprintf(strBuf + iVar3,"  GEO parameters: gen_mx = %d, shape function = %d (%s)\n",
                    (ulong)(uint)gen_mx,(ulong)shape_fn,uts_geoshapes_str[shape_fn]);
    iVar3 = iVar3 + iVar4;
  }
  if ((type & ~HYBRID) == BIN) {
    iVar4 = sprintf(strBuf + iVar3,"  BIN parameters:  q = %f, m = %d, E(n) = %f, E(s) = %.2f\n",
                    SUB84(nonLeafProb,0),(double)nonLeafBF * nonLeafProb,
                    1.0 / (1.0 - (double)nonLeafBF * nonLeafProb));
    iVar3 = iVar3 + iVar4;
  }
  if (type == HYBRID) {
    dVar1 = ceil((double)gen_mx * shiftDepth);
    iVar4 = sprintf(strBuf + iVar3,"  HYBRID:  GEO from root to depth %d, then BIN\n",
                    (ulong)(uint)(int)dVar1);
    iVar3 = iVar3 + iVar4;
  }
  if (type == BALANCED) {
    iVar4 = sprintf(strBuf + iVar3,"  BALANCED parameters: gen_mx = %d\n",(ulong)(uint)gen_mx);
    dVar1 = pow(b_0,(double)(gen_mx + 1));
    dVar1 = (dVar1 + -1.0) / (b_0 + -1.0);
    uVar7 = (ulong)dVar1;
    dVar2 = pow(b_0,(double)gen_mx);
    iVar5 = sprintf(strBuf + (iVar3 + iVar4),"        Expected size: %llu nodes, %llu leaves\n",
                    (long)(dVar1 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7,
                    (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2);
    iVar3 = iVar3 + iVar4 + iVar5;
  }
  builtin_strncpy(strBuf + (long)iVar3 + 10,"ber generator: ",0x10);
  builtin_strncpy(strBuf + iVar3,"Random number ge",0x10);
  iVar3 = rng_showtype(strBuf,iVar3 + 0x19);
  iVar4 = sprintf(strBuf + iVar3,"\nCompute granularity: %d\n",(ulong)(uint)computeGranularity);
  return iVar4 + iVar3;
}

Assistant:

int uts_paramsToStr(char *strBuf, int ind) {
  // version + execution model
  ind += sprintf(strBuf+ind, "UTS - Unbalanced Tree Search %s (%s)\n", UTS_VERSION, impl_getName());

  // tree type
  ind += sprintf(strBuf+ind, "Tree type:  %d (%s)\n", type, uts_trees_str[type]);
	
  // tree shape parameters
  ind += sprintf(strBuf+ind, "Tree shape parameters:\n");
  ind += sprintf(strBuf+ind, "  root branching factor b_0 = %.1f, root seed = %d\n", b_0, rootId);
	
  if (type == GEO || type == HYBRID) {
    ind += sprintf(strBuf+ind, "  GEO parameters: gen_mx = %d, shape function = %d (%s)\n", 
            gen_mx, shape_fn, uts_geoshapes_str[shape_fn]);
  }

  if (type == BIN || type == HYBRID) {
    double q = nonLeafProb;
    int    m = nonLeafBF;
    double es  = (1.0 / (1.0 - q * m));
    ind += sprintf(strBuf+ind, "  BIN parameters:  q = %f, m = %d, E(n) = %f, E(s) = %.2f\n",
            q, m, q * m, es);
  }

  if (type == HYBRID) {
    ind += sprintf(strBuf+ind, "  HYBRID:  GEO from root to depth %d, then BIN\n", 
            (int) ceil(shiftDepth * gen_mx));
  }
	
  if (type == BALANCED) {
    ind += sprintf(strBuf+ind, "  BALANCED parameters: gen_mx = %d\n", gen_mx);
    ind += sprintf(strBuf+ind, "        Expected size: %llu nodes, %llu leaves\n",
        (counter_t) ((pow(b_0, gen_mx+1) - 1.0)/(b_0 - 1.0)) /* geometric series */,
        (counter_t) pow(b_0, gen_mx));
  }
	
  // random number generator
  ind += sprintf(strBuf+ind, "Random number generator: ");
  ind  = rng_showtype(strBuf, ind);
  ind += sprintf(strBuf+ind, "\nCompute granularity: %d\n", computeGranularity);

  return ind;
}